

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Am_Receive_Method *method)

{
  Am_Receive_Method *method_local;
  ostream *os_local;
  
  Am_Receive_Method::Print(method,os);
  return os;
}

Assistant:

void
Am_Connection::Reset(void)
{
  connection_list = nullptr;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  socket_flags = new fd_set;
  FD_ZERO(socket_flags);
  Register_Default_Methods();
}